

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

shared_ptr<tinygraph::Vertex> __thiscall
tinygraph::Graph::add(Graph *this,string *name,shared_ptr<tinygraph::Type> *type)

{
  undefined8 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<tinygraph::Vertex> sVar2;
  shared_ptr<tinygraph::Vertex> local_30;
  shared_ptr<tinygraph::Type> local_20;
  
  local_20.super___shared_ptr<tinygraph::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RCX;
  local_20.super___shared_ptr<tinygraph::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX[1];
  in_RCX[1] = 0;
  *in_RCX = 0;
  vertex_create((tinygraph *)this,(string *)type,&local_20);
  if (local_20.super___shared_ptr<tinygraph::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<tinygraph::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&(this->vertices)._M_t._M_impl;
  local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        &(this->vertices)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  add_vertex((Graph *)name,&local_30);
  _Var1._M_pi = extraout_RDX;
  if (local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tinygraph::Vertex>)
         sVar2.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Vertex> Graph::add(const std::string &name, std::shared_ptr<Type> type) {
        auto v = vertex_create(name, std::move(type));
        this->add_vertex(v);
        return v;
    }